

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Resim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  Cec_ParSim_t Pars;
  Cec_ParSim_t local_60;
  
  Cec_ManSimSetDefaultParams(&local_60);
  Extra_UtilGetoptReset();
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Fmvh"), iVar2 = globalUtilOptind, 0x6c < iVar1) {
      piVar3 = &local_60.fCheckMiter;
      if (iVar1 != 0x6d) {
        if (iVar1 != 0x76) goto LAB_0027b3a9;
        piVar3 = &local_60.fVerbose;
      }
      *(byte *)piVar3 = (byte)*piVar3 ^ 1;
    }
    if (iVar1 != 0x46) {
      if (iVar1 == -1) {
        if (pAbc->pGia != (Gia_Man_t *)0x0) {
          iVar2 = Cec_ManSeqResimulateCounter(pAbc->pGia,&local_60,pAbc->pCex);
          pAbc->Status = -(uint)(iVar2 == 0);
          pAbc->nFrames = pAbc->pCex->iFrame;
          return 0;
        }
        pcVar4 = "Abc_CommandAbc9Resim(): There is no AIG.\n";
        iVar2 = -1;
        goto LAB_0027b446;
      }
      break;
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      break;
    }
    local_60.nFrames = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
  } while (-1 < local_60.nFrames);
LAB_0027b3a9:
  Abc_Print(-2,"usage: &resim [-F num] [-mvh]\n");
  Abc_Print(-2,"\t         resimulates equivalence classes using counter-example\n");
  Abc_Print(-2,"\t-F num : the number of additinal frames to simulate [default = %d]\n",
            (ulong)(uint)local_60.nFrames);
  pcVar4 = "miter";
  if (local_60.fCheckMiter == 0) {
    pcVar4 = "circuit";
  }
  Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if (local_60.fVerbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  pcVar4 = "\t-h     : print the command usage\n";
  iVar2 = -2;
LAB_0027b446:
  Abc_Print(iVar2,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandAbc9Resim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParSim_t Pars, * pPars = &Pars;
    int c, RetValue;
    Cec_ManSimSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'm':
            pPars->fCheckMiter ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Resim(): There is no AIG.\n" );
        return 1;
    }
    RetValue = Cec_ManSeqResimulateCounter( pAbc->pGia, pPars, pAbc->pCex );
    pAbc->Status  = RetValue ? 0 : -1;
    pAbc->nFrames = pAbc->pCex->iFrame;
//    Abc_FrameReplaceCex( pAbc, &pAbc->pCex );
    return 0;

usage:
    Abc_Print( -2, "usage: &resim [-F num] [-mvh]\n" );
    Abc_Print( -2, "\t         resimulates equivalence classes using counter-example\n" );
    Abc_Print( -2, "\t-F num : the number of additinal frames to simulate [default = %d]\n", pPars->nFrames );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", pPars->fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}